

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ellswift_encode
              (secp256k1_context *ctx,uchar *ell64,secp256k1_pubkey *pubkey,uchar *rnd32)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char cVar10;
  int iVar11;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong uVar12;
  long lVar13;
  secp256k1_sha256 *psVar14;
  uchar *data;
  secp256k1_ecmult_gen_context *extraout_RDX;
  ulong uVar15;
  secp256k1_fe *psVar16;
  uchar *seckey;
  secp256k1_ecmult_gen_context *a;
  secp256k1_ecmult_gen_context *psVar17;
  secp256k1_ecmult_gen_context *a_00;
  secp256k1_ecmult_gen_context *psVar18;
  secp256k1_ecmult_gen_context *psVar19;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  secp256k1_ecmult_gen_context *r;
  uint uVar23;
  secp256k1_fe *psVar24;
  secp256k1_fe *psVar25;
  secp256k1_fe *psVar26;
  secp256k1_fe *psVar27;
  secp256k1_fe *psVar28;
  secp256k1_fe *psVar29;
  secp256k1_ecmult_gen_context *r_00;
  secp256k1_ecmult_gen_context *psVar30;
  secp256k1_ecmult_gen_context *psVar31;
  secp256k1_ecmult_gen_context *psVar32;
  secp256k1_ecmult_gen_context *a_01;
  undefined1 auVar33 [16];
  size_t ser_size;
  uchar p64 [64];
  secp256k1_ge p;
  secp256k1_fe t;
  secp256k1_scalar asStack_534 [17];
  secp256k1_ge sStack_4f0;
  secp256k1_sha256 sStack_488;
  secp256k1_fe sStack_420;
  secp256k1_ecmult_gen_context *psStack_3f0;
  secp256k1_ecmult_gen_context *psStack_3e8;
  secp256k1_fe *psStack_3e0;
  secp256k1_ecmult_gen_context *psStack_3d8;
  secp256k1_ecmult_gen_context *psStack_3d0;
  secp256k1_ecmult_gen_context *psStack_3c8;
  undefined1 auStack_3c0 [56];
  ulong uStack_388;
  undefined1 *puStack_380;
  ulong uStack_378;
  uchar *puStack_370;
  ulong uStack_368;
  undefined1 auStack_360 [56];
  uint64_t uStack_328;
  uint64_t uStack_320;
  uint64_t uStack_318;
  uchar *puStack_310;
  uint64_t uStack_308;
  undefined1 auStack_300 [56];
  uint64_t uStack_2c8;
  secp256k1_ecmult_gen_context *psStack_2c0;
  uint64_t uStack_2b8;
  uchar *puStack_2b0;
  uint64_t uStack_2a8;
  uint uStack_294;
  secp256k1_sha256 *psStack_290;
  secp256k1_ecmult_gen_context *psStack_288;
  ulong uStack_280;
  secp256k1_ecmult_gen_context *psStack_278;
  secp256k1_ecmult_gen_context *psStack_270;
  ulong uStack_268;
  secp256k1_ecmult_gen_context sStack_260;
  uchar *puStack_1a8;
  size_t local_170;
  secp256k1_sha256 local_168;
  undefined1 local_f8 [176];
  secp256k1_fe local_48;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ellswift_encode_cold_5();
LAB_0010f9b5:
    secp256k1_ellswift_encode_cold_4();
    return 0;
  }
  if (ell64 == (uchar *)0x0) goto LAB_0010f9b5;
  if (pubkey == (secp256k1_pubkey *)0x0) {
    secp256k1_ellswift_encode_cold_3();
    return 0;
  }
  if (rnd32 == (uchar *)0x0) {
    secp256k1_ellswift_encode_cold_2();
    return 0;
  }
  iVar11 = secp256k1_pubkey_load(ctx,(secp256k1_ge *)(local_f8 + 0x48),pubkey);
  if (iVar11 == 0) {
    ell64[0x30] = '\0';
    ell64[0x31] = '\0';
    ell64[0x32] = '\0';
    ell64[0x33] = '\0';
    ell64[0x34] = '\0';
    ell64[0x35] = '\0';
    ell64[0x36] = '\0';
    ell64[0x37] = '\0';
    ell64[0x38] = '\0';
    ell64[0x39] = '\0';
    ell64[0x3a] = '\0';
    ell64[0x3b] = '\0';
    ell64[0x3c] = '\0';
    ell64[0x3d] = '\0';
    ell64[0x3e] = '\0';
    ell64[0x3f] = '\0';
    ell64[0x20] = '\0';
    ell64[0x21] = '\0';
    ell64[0x22] = '\0';
    ell64[0x23] = '\0';
    ell64[0x24] = '\0';
    ell64[0x25] = '\0';
    ell64[0x26] = '\0';
    ell64[0x27] = '\0';
    ell64[0x28] = '\0';
    ell64[0x29] = '\0';
    ell64[0x2a] = '\0';
    ell64[0x2b] = '\0';
    ell64[0x2c] = '\0';
    ell64[0x2d] = '\0';
    ell64[0x2e] = '\0';
    ell64[0x2f] = '\0';
    ell64[0x10] = '\0';
    ell64[0x11] = '\0';
    ell64[0x12] = '\0';
    ell64[0x13] = '\0';
    ell64[0x14] = '\0';
    ell64[0x15] = '\0';
    ell64[0x16] = '\0';
    ell64[0x17] = '\0';
    ell64[0x18] = '\0';
    ell64[0x19] = '\0';
    ell64[0x1a] = '\0';
    ell64[0x1b] = '\0';
    ell64[0x1c] = '\0';
    ell64[0x1d] = '\0';
    ell64[0x1e] = '\0';
    ell64[0x1f] = '\0';
    ell64[0] = '\0';
    ell64[1] = '\0';
    ell64[2] = '\0';
    ell64[3] = '\0';
    ell64[4] = '\0';
    ell64[5] = '\0';
    ell64[6] = '\0';
    ell64[7] = '\0';
    ell64[8] = '\0';
    ell64[9] = '\0';
    ell64[10] = '\0';
    ell64[0xb] = '\0';
    ell64[0xc] = '\0';
    ell64[0xd] = '\0';
    ell64[0xe] = '\0';
    ell64[0xf] = '\0';
    return 0;
  }
  psVar17 = (secp256k1_ecmult_gen_context *)local_f8;
  local_f8._48_4_ = 0;
  local_f8._52_4_ = 0;
  local_f8._56_8_ = 0;
  local_f8._32_8_ = 0;
  local_f8._40_8_ = 0;
  local_f8._16_8_ = 0;
  local_f8._24_8_ = 0;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  local_f8._8_8_ = 0;
  local_168.s[0] = 0xd1a6524b;
  local_168.s[1] = 0x28594b3;
  local_168.s[2] = 0x96e42f4e;
  local_168.s[3] = 0x1037a177;
  local_168.s[4] = 0x1b8fcb8b;
  local_168.s[5] = 0x56023885;
  local_168.s[6] = 0x2560ede1;
  local_168.s[7] = 0xd626b715;
  local_168.bytes = 0x40;
  psVar19 = (secp256k1_ecmult_gen_context *)(local_f8 + 0x48);
  psVar14 = (secp256k1_sha256 *)0x1;
  iVar11 = secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar19,(uchar *)psVar17,&local_170,1);
  if ((iVar11 != 0) && (local_170 == 0x21)) {
    secp256k1_sha256_write(&local_168,local_f8,0x40);
    secp256k1_sha256_write(&local_168,rnd32,0x20);
    secp256k1_ellswift_elligatorswift_var
              (ell64,&local_48,(secp256k1_ge *)(local_f8 + 0x48),&local_168);
    secp256k1_fe_get_b32(ell64 + 0x20,&local_48);
    return 1;
  }
  secp256k1_ellswift_encode_cold_1();
  puStack_1a8 = ell64;
  a = (secp256k1_ecmult_gen_context *)auStack_3c0;
  psVar25 = (secp256k1_fe *)auStack_3c0;
  a_01 = (secp256k1_ecmult_gen_context *)auStack_3c0;
  psVar31 = (secp256k1_ecmult_gen_context *)auStack_3c0;
  psVar26 = (secp256k1_fe *)auStack_3c0;
  psVar16 = (secp256k1_fe *)auStack_3c0;
  psVar27 = (secp256k1_fe *)auStack_3c0;
  psVar28 = (secp256k1_fe *)auStack_3c0;
  psVar29 = (secp256k1_fe *)auStack_3c0;
  psVar18 = (secp256k1_ecmult_gen_context *)auStack_3c0;
  psStack_288 = extraout_RDX;
  psStack_278 = psVar17;
  psStack_270 = psVar19;
  r = (secp256k1_ecmult_gen_context *)0xfffffffffffff;
  psVar17 = (secp256k1_ecmult_gen_context *)(auStack_300 + 0x30);
  psVar19 = (secp256k1_ecmult_gen_context *)(auStack_3c0 + 0x30);
  uVar15 = 0;
  psStack_290 = psVar14;
  uVar12 = 0;
LAB_0010fa1b:
  iVar11 = (int)uVar12;
  if (iVar11 == 0) {
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fa33;
    secp256k1_ellswift_prng((uchar *)(sStack_260.proj_blind.n + 4),psStack_290,(uint32_t)uVar15);
    iVar11 = 0x40;
    uVar15 = (ulong)((uint32_t)uVar15 + 1);
  }
  psVar32 = psStack_270;
  uStack_280 = (ulong)(iVar11 - 1U);
  bVar3 = *(byte *)((long)sStack_260.proj_blind.n + (ulong)(iVar11 - 1U >> 1) + 0x20);
  psVar24 = (secp256k1_fe *)(ulong)bVar3;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fa73;
  uStack_268 = uVar15;
  secp256k1_ellswift_prng((uchar *)psStack_270,psStack_290,(uint32_t)uVar15);
  r_00 = &sStack_260;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fa86;
  secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)r_00,(uchar *)psVar32);
  sStack_260.ge_offset.x.n[4] = 1;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fa9a;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10faa2;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  uVar12 = (sStack_260.ge_offset.x.n[3] >> 0x30) * 0x1000003d1 + sStack_260._0_8_;
  if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
    uVar15 = (uVar12 >> 0x34) + sStack_260.ge_offset.x.n[0];
    a_00 = (secp256k1_ecmult_gen_context *)((uVar15 >> 0x34) + sStack_260.ge_offset.x.n[1]);
    ecmult_gen_ctx =
         (secp256k1_ecmult_gen_context *)(((ulong)a_00 >> 0x34) + sStack_260.ge_offset.x.n[2]);
    uVar21 = ((ulong)ecmult_gen_ctx >> 0x34) + (sStack_260.ge_offset.x.n[3] & 0xffffffffffff);
    data = (uchar *)((uVar15 | uVar12 | (ulong)a_00 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                    uVar21);
    if ((data != (uchar *)0x0) &&
       (data = (uchar *)0x1000003d1,
       (uVar12 + 0x1000003d0 & uVar15 & (ulong)a_00 & (ulong)ecmult_gen_ctx &
       (uVar21 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0010fb73;
LAB_001108f8:
    psVar31 = psVar32;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1108fd;
    secp256k1_ellswift_elligatorswift_var_cold_1();
LAB_001108fd:
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110902;
    secp256k1_ellswift_elligatorswift_var_cold_7();
    psVar32 = psVar31;
LAB_00110902:
    psVar26 = psVar24;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110907;
    secp256k1_ellswift_elligatorswift_var_cold_14();
LAB_00110907:
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11090c;
    secp256k1_ellswift_elligatorswift_var_cold_6();
    psVar16 = psVar26;
LAB_0011090c:
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110911;
    secp256k1_ellswift_elligatorswift_var_cold_5();
    psVar27 = psVar16;
LAB_00110911:
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110916;
    secp256k1_ellswift_elligatorswift_var_cold_4();
    goto LAB_00110916;
  }
LAB_0010fb73:
  bVar3 = bVar3 >> ((char)uStack_280 * '\x04' & 4U);
  uVar23 = (uint)bVar3;
  psVar24 = (secp256k1_fe *)(ulong)uVar23;
  auStack_360._48_4_ = psStack_288->built;
  auStack_360._52_4_ = psStack_288->scalar_offset;
  uStack_328 = (psStack_288->ge_offset).x.n[0];
  uStack_320 = (psStack_288->ge_offset).x.n[1];
  uStack_318 = (psStack_288->ge_offset).x.n[2];
  puStack_310 = (uchar *)(psStack_288->ge_offset).x.n[3];
  uStack_308 = (psStack_288->ge_offset).x.n[4];
  puStack_2b0 = (uchar *)sStack_260.ge_offset.x.n[3];
  uStack_2a8 = sStack_260.ge_offset.x.n[4];
  psStack_2c0 = (secp256k1_ecmult_gen_context *)sStack_260.ge_offset.x.n[1];
  uStack_2b8 = sStack_260.ge_offset.x.n[2];
  auStack_300._48_4_ = sStack_260.built;
  auStack_300._52_4_ = sStack_260.scalar_offset;
  uStack_2c8 = sStack_260.ge_offset.x.n[0];
  r_00 = (secp256k1_ecmult_gen_context *)(auStack_360 + 0x30);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fbf3;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  uVar12 = ((ulong)puStack_310 >> 0x30) * 0x1000003d1 + auStack_360._48_8_;
  uVar15 = (uVar12 >> 0x34) + uStack_328;
  uVar21 = (uVar15 >> 0x34) + uStack_320;
  uVar20 = (uVar21 >> 0x34) + uStack_318;
  uStack_318 = uVar20 & 0xfffffffffffff;
  puStack_310 = (uchar *)((uVar20 >> 0x34) + ((ulong)puStack_310 & 0xffffffffffff));
  uStack_320 = uVar21 & 0xfffffffffffff;
  uStack_328 = uVar15 & 0xfffffffffffff;
  auStack_360._48_8_ = uVar12 & 0xfffffffffffff;
  uStack_308 = CONCAT44(uStack_308._4_4_,1);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fca7;
  secp256k1_fe_verify((secp256k1_fe *)r_00);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fcaf;
  secp256k1_fe_verify((secp256k1_fe *)psVar17);
  auStack_300._48_8_ = ((ulong)puStack_2b0 >> 0x30) * 0x1000003d1 + auStack_300._48_8_;
  uStack_2c8 = ((ulong)auStack_300._48_8_ >> 0x34) + uStack_2c8;
  uVar12 = (uStack_2c8 >> 0x34) + (long)psStack_2c0;
  uVar15 = (uVar12 >> 0x34) + uStack_2b8;
  uStack_2b8 = uVar15 & 0xfffffffffffff;
  data = (uchar *)((ulong)puStack_2b0 & 0xffffffffffff);
  puStack_2b0 = data + (uVar15 >> 0x34);
  a_00 = (secp256k1_ecmult_gen_context *)(uVar12 & 0xfffffffffffff);
  uStack_2c8 = uStack_2c8 & 0xfffffffffffff;
  auStack_300._48_8_ = auStack_300._48_8_ & 0xfffffffffffff;
  uStack_2a8 = CONCAT44(uStack_2a8._4_4_,1);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fd59;
  psStack_2c0 = a_00;
  secp256k1_fe_verify((secp256k1_fe *)psVar17);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fd61;
  ecmult_gen_ctx = r_00;
  iVar11 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)r_00);
  if (iVar11 == 0) {
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1108f8;
    secp256k1_ellswift_elligatorswift_var_cold_15();
    psVar32 = (secp256k1_ecmult_gen_context *)0xfffffffffffff;
    goto LAB_001108f8;
  }
  r_00 = (secp256k1_ecmult_gen_context *)(ulong)uVar23;
  if ((bVar3 & 2) != 0) {
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1100a2;
    secp256k1_fe_verify((secp256k1_fe *)psVar17);
    a_00 = (secp256k1_ecmult_gen_context *)0x1;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1100af;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar17,1);
    auStack_3c0._48_8_ = 0x3ffffbfffff0bc - auStack_300._48_8_;
    uStack_388 = 0x3ffffffffffffc - uStack_2c8;
    puStack_380 = (undefined1 *)(0x3ffffffffffffc - (long)psStack_2c0);
    uStack_378 = 0x3ffffffffffffc - uStack_2b8;
    puStack_370 = (uchar *)(0x3fffffffffffc - (long)puStack_2b0);
    uStack_368 = 2;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110105;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    auStack_3c0._32_8_ = puStack_370;
    auStack_3c0._40_8_ = uStack_368;
    auStack_3c0._16_8_ = puStack_380;
    auStack_3c0._24_8_ = uStack_378;
    auStack_3c0._0_8_ = auStack_3c0._48_8_;
    auStack_3c0._8_8_ = uStack_388;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11012f;
    secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(auStack_360 + 0x30);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11013c;
    secp256k1_fe_verify((secp256k1_fe *)ecmult_gen_ctx);
    if (0x20 < (int)uStack_308 + auStack_3c0._40_4_) goto LAB_001108fd;
    auStack_3c0._0_8_ = auStack_3c0._0_8_ + auStack_360._48_8_;
    auStack_3c0._8_8_ = auStack_3c0._8_8_ + uStack_328;
    auStack_3c0._16_8_ = auStack_3c0._16_8_ + uStack_320;
    auStack_3c0._24_8_ = auStack_3c0._24_8_ + uStack_318;
    auStack_3c0._32_8_ = auStack_3c0._32_8_ + (long)puStack_310;
    auStack_3c0._44_4_ = 0;
    auStack_3c0._40_4_ = (int)uStack_308 + auStack_3c0._40_4_;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110199;
    data = puStack_310;
    secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1101a1;
    iVar11 = secp256k1_fe_is_square_var((secp256k1_fe *)auStack_3c0);
    if (iVar11 == 0) goto LAB_001105e1;
    psVar32 = (secp256k1_ecmult_gen_context *)auStack_300;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1101c7;
    uStack_294 = uVar23;
    secp256k1_fe_sqr((secp256k1_fe *)psVar32,(secp256k1_fe *)psVar17);
    r_00 = (secp256k1_ecmult_gen_context *)auStack_360;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1101da;
    a_00 = (secp256k1_ecmult_gen_context *)auStack_3c0;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)auStack_3c0,(secp256k1_fe *)psVar32);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1101e2;
    ecmult_gen_ctx = r_00;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (10 < (int)auStack_360._40_4_) goto LAB_00110907;
    auStack_360._0_8_ = auStack_360._0_8_ * 3;
    auStack_360._8_8_ = auStack_360._8_8_ * 3;
    auStack_360._16_8_ = auStack_360._16_8_ * 3;
    auStack_360._24_8_ = auStack_360._24_8_ * 3;
    data = (uchar *)(auStack_360._32_8_ * 3);
    auStack_360._44_4_ = 0;
    auStack_360._40_4_ = auStack_360._40_4_ * 3;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11025b;
    auStack_360._32_8_ = data;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110269;
    a_00 = psVar32;
    secp256k1_fe_mul((secp256k1_fe *)psVar32,(secp256k1_fe *)psVar32,(secp256k1_fe *)psVar17);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110271;
    ecmult_gen_ctx = psVar32;
    secp256k1_fe_verify((secp256k1_fe *)psVar32);
    if (8 < (int)auStack_300._40_4_) goto LAB_0011090c;
    auStack_300._0_8_ = auStack_300._0_8_ << 2;
    auStack_300._8_8_ = auStack_300._8_8_ << 2;
    auStack_300._16_8_ = auStack_300._16_8_ << 2;
    auStack_300._24_8_ = auStack_300._24_8_ << 2;
    auStack_300._32_8_ = auStack_300._32_8_ << 2;
    auStack_300._40_4_ = auStack_300._40_4_ << 2;
    auStack_300._44_4_ = 0;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1102da;
    secp256k1_fe_verify((secp256k1_fe *)auStack_300);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1102e7;
    secp256k1_fe_verify((secp256k1_fe *)auStack_300);
    auStack_300._0_8_ = auStack_300._0_8_ + 8;
    auStack_300._40_4_ = auStack_300._40_4_ + 1;
    auStack_300._44_4_ = 0;
    psVar32 = (secp256k1_ecmult_gen_context *)auStack_300;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11030f;
    secp256k1_fe_verify((secp256k1_fe *)psVar32);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110317;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11031f;
    ecmult_gen_ctx = psVar32;
    secp256k1_fe_verify((secp256k1_fe *)psVar32);
    if (0x20 < (int)(auStack_300._40_4_ + auStack_360._40_4_)) goto LAB_00110911;
    auStack_360._0_8_ = auStack_360._0_8_ + auStack_300._0_8_;
    auStack_360._8_8_ = auStack_360._8_8_ + auStack_300._8_8_;
    auStack_360._16_8_ = auStack_360._16_8_ + auStack_300._16_8_;
    auStack_360._24_8_ = auStack_360._24_8_ + auStack_300._24_8_;
    auStack_360._32_8_ = auStack_360._32_8_ + auStack_300._32_8_;
    auStack_360._44_4_ = 0;
    auStack_360._40_4_ = auStack_300._40_4_ + auStack_360._40_4_;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11038a;
    data = (uchar *)auStack_300._32_8_;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11039b;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,(secp256k1_fe *)auStack_3c0);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1103a3;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1103b0;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)r_00,1);
    auStack_360._0_8_ = 0x3ffffbfffff0bc - auStack_360._0_8_;
    auStack_360._8_8_ = 0x3ffffffffffffc - auStack_360._8_8_;
    auStack_360._16_8_ = 0x3ffffffffffffc - auStack_360._16_8_;
    auStack_360._24_8_ = 0x3ffffffffffffc - auStack_360._24_8_;
    auStack_360._32_8_ = 0x3fffffffffffc - auStack_360._32_8_;
    auStack_360._40_8_ = 2;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110406;
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11040e;
    iVar11 = secp256k1_fe_is_square_var((secp256k1_fe *)r_00);
    uVar23 = uStack_294;
    psVar30 = (secp256k1_ecmult_gen_context *)(ulong)uStack_294;
    if (iVar11 != 0) {
      ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)&sStack_260.ge_offset.y.magnitude;
      a_00 = (secp256k1_ecmult_gen_context *)auStack_360;
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110430;
      iVar11 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)a_00);
      psVar32 = (secp256k1_ecmult_gen_context *)auStack_3c0;
      if (iVar11 == 0) goto LAB_0011092a;
      if ((uVar23 & 1) != 0) {
        psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11044f;
        secp256k1_fe_verify((secp256k1_fe *)&sStack_260.ge_offset.y.magnitude);
        uVar12 = (sStack_260.proj_blind.n[2] >> 0x30) * 0x1000003d1 + sStack_260.ge_offset.y._40_8_;
        if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
          uVar15 = (uVar12 >> 0x34) + sStack_260.ge_offset._96_8_;
          uVar21 = (uVar15 >> 0x34) + sStack_260.proj_blind.n[0];
          uVar20 = (uVar21 >> 0x34) + sStack_260.proj_blind.n[1];
          uVar22 = (uVar20 >> 0x34) + (sStack_260.proj_blind.n[2] & 0xffffffffffff);
          if ((((uVar15 | uVar12 | uVar21 | uVar20) & 0xfffffffffffff) == 0 && uVar22 == 0) ||
             ((uVar12 + 0x1000003d0 & uVar15 & uVar21 & uVar20 & (uVar22 ^ 0xf000000000000)) ==
              0xfffffffffffff)) goto LAB_001105e1;
        }
      }
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110528;
      secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
      uVar12 = ((ulong)auStack_3c0._32_8_ >> 0x30) * 0x1000003d1 + auStack_3c0._0_8_;
      if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) ||
         (data = (uchar *)auStack_3c0._32_8_, (uVar12 & 0xfffffffffffff) == 0)) {
        uVar15 = (uVar12 >> 0x34) + auStack_3c0._8_8_;
        uVar21 = (uVar15 >> 0x34) + auStack_3c0._16_8_;
        uVar20 = (uVar21 >> 0x34) + auStack_3c0._24_8_;
        uVar22 = (uVar20 >> 0x34) + (auStack_3c0._32_8_ & 0xffffffffffff);
        if ((((uVar15 | uVar12 | uVar21 | uVar20) & 0xfffffffffffff) == 0 && uVar22 == 0) ||
           (data = (uchar *)0x1000003d1,
           (uVar12 + 0x1000003d0 & uVar15 & uVar21 & uVar20 & (uVar22 ^ 0xf000000000000)) ==
           0xfffffffffffff)) goto LAB_001105e1;
      }
      psVar17 = (secp256k1_ecmult_gen_context *)&sStack_260.ge_offset.x.magnitude;
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110613;
      secp256k1_fe_inv_var((secp256k1_fe *)psVar17,(secp256k1_fe *)auStack_3c0);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110626;
      a_00 = psVar17;
      secp256k1_fe_mul((secp256k1_fe *)psVar17,(secp256k1_fe *)psVar17,
                       (secp256k1_fe *)&sStack_260.ge_offset.y.magnitude);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11062e;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      a_01 = (secp256k1_ecmult_gen_context *)(auStack_3c0 + 0x30);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11063b;
      ecmult_gen_ctx = a_01;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      if (0x20 < (int)uStack_368 + (int)sStack_260.ge_offset.y.n[4]) goto LAB_0011092f;
      a = (secp256k1_ecmult_gen_context *)&sStack_260.ge_offset.x.magnitude;
      sStack_260.ge_offset.x._40_8_ = sStack_260.ge_offset.x._40_8_ + auStack_3c0._48_8_;
      sStack_260.ge_offset.y.n[0] = sStack_260.ge_offset.y.n[0] + uStack_388;
      sStack_260.ge_offset.y.n[1] = sStack_260.ge_offset.y.n[1] + (long)puStack_380;
      sStack_260.ge_offset.y.n[2] = sStack_260.ge_offset.y.n[2] + uStack_378;
      sStack_260.ge_offset.y.n[3] = sStack_260.ge_offset.y.n[3] + (long)puStack_370;
      sStack_260.ge_offset.y.n[4] =
           (uint64_t)(uint)((int)uStack_368 + (int)sStack_260.ge_offset.y.n[4]);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11068c;
      data = puStack_370;
      secp256k1_fe_verify((secp256k1_fe *)a);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110694;
      secp256k1_fe_half((secp256k1_fe *)a);
      r_00 = psVar30;
      goto LAB_00110694;
    }
LAB_001105e1:
    uVar15 = (ulong)((int)uStack_268 + 1);
    uVar12 = uStack_280;
    goto LAB_0010fa1b;
  }
  puStack_370 = puStack_310;
  uStack_368 = uStack_308;
  puStack_380 = (undefined1 *)uStack_320;
  uStack_378 = uStack_318;
  auStack_3c0._48_8_ = auStack_360._48_8_;
  uStack_388 = uStack_328;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fda7;
  secp256k1_fe_verify((secp256k1_fe *)psVar19);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fdaf;
  ecmult_gen_ctx = psVar17;
  secp256k1_fe_verify((secp256k1_fe *)psVar17);
  psVar32 = (secp256k1_ecmult_gen_context *)auStack_3c0;
  if (0x20 < (int)uStack_2a8 + (int)uStack_368) goto LAB_00110902;
  auStack_3c0._48_8_ = auStack_3c0._48_8_ + auStack_300._48_8_;
  uStack_388 = uStack_388 + uStack_2c8;
  puStack_380 = (undefined1 *)((long)(psStack_2c0->ge_offset).x.n + ((long)puStack_380 - 8U));
  uStack_378 = uStack_378 + uStack_2b8;
  puStack_370 = puStack_370 + (long)puStack_2b0;
  uStack_368 = (ulong)(uint)((int)uStack_2a8 + (int)uStack_368);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe11;
  data = puStack_2b0;
  secp256k1_fe_verify((secp256k1_fe *)psVar19);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe19;
  secp256k1_fe_verify((secp256k1_fe *)psVar19);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe26;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar19,2);
  auStack_3c0._48_8_ = 0x5ffff9ffffe91a - auStack_3c0._48_8_;
  uStack_388 = 0x5ffffffffffffa - uStack_388;
  puStack_380 = (undefined1 *)(0x5ffffffffffffa - (long)puStack_380);
  uStack_378 = 0x5ffffffffffffa - uStack_378;
  puStack_370 = (uchar *)(0x5fffffffffffa - (long)puStack_370);
  uStack_368 = 3;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe73;
  secp256k1_fe_verify((secp256k1_fe *)psVar19);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe7b;
  iVar11 = secp256k1_ge_x_on_curve_var((secp256k1_fe *)psVar19);
  if (iVar11 != 0) goto LAB_001105e1;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe8e;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_3c0,(secp256k1_fe *)psVar19);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fe96;
  secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10fea3;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_3c0,1);
  auStack_3c0._0_8_ = 0x3ffffbfffff0bc - auStack_3c0._0_8_;
  auStack_3c0._8_8_ = 0x3ffffffffffffc - auStack_3c0._8_8_;
  auStack_3c0._16_8_ = 0x3ffffffffffffc - auStack_3c0._16_8_;
  auStack_3c0._24_8_ = 0x3ffffffffffffc - auStack_3c0._24_8_;
  auStack_3c0._32_8_ = 0x3fffffffffffc - auStack_3c0._32_8_;
  auStack_3c0._40_8_ = 2;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10feee;
  secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10ff01;
  a_00 = psVar17;
  secp256k1_fe_mul((secp256k1_fe *)psVar19,(secp256k1_fe *)psVar17,
                   (secp256k1_fe *)(auStack_360 + 0x30));
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10ff09;
  secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10ff11;
  ecmult_gen_ctx = psVar19;
  secp256k1_fe_verify((secp256k1_fe *)psVar19);
  psVar30 = r_00;
  psVar32 = (secp256k1_ecmult_gen_context *)auStack_3c0;
  if (0x20 < (int)uStack_368 + auStack_3c0._40_4_) goto LAB_00110934;
  auStack_3c0._0_8_ = auStack_3c0._0_8_ + auStack_3c0._48_8_;
  auStack_3c0._8_8_ = auStack_3c0._8_8_ + uStack_388;
  auStack_3c0._16_8_ = auStack_3c0._16_8_ + (long)puStack_380;
  auStack_3c0._24_8_ = auStack_3c0._24_8_ + uStack_378;
  auStack_3c0._32_8_ = auStack_3c0._32_8_ + (long)puStack_370;
  auStack_3c0._44_4_ = 0;
  auStack_3c0._40_4_ = (int)uStack_368 + auStack_3c0._40_4_;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10ff62;
  secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x10ff6a;
  secp256k1_fe_verify((secp256k1_fe *)auStack_3c0);
  uVar12 = ((ulong)auStack_3c0._32_8_ >> 0x30) * 0x1000003d1 + auStack_3c0._0_8_;
  if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) ||
     (data = (uchar *)auStack_3c0._32_8_, (uVar12 & 0xfffffffffffff) == 0)) {
    uVar15 = (uVar12 >> 0x34) + auStack_3c0._8_8_;
    a_00 = (secp256k1_ecmult_gen_context *)((uVar15 >> 0x34) + auStack_3c0._16_8_);
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(((ulong)a_00 >> 0x34) + auStack_3c0._24_8_);
    uVar21 = ((ulong)ecmult_gen_ctx >> 0x34) + (auStack_3c0._32_8_ & 0xffffffffffff);
    data = (uchar *)((uVar15 | uVar12 | (ulong)a_00 | (ulong)ecmult_gen_ctx) & 0xfffffffffffff |
                    uVar21);
    psVar32 = (secp256k1_ecmult_gen_context *)auStack_3c0;
    if ((data == (uchar *)0x0) ||
       (data = (uchar *)0x1000003d1, psVar32 = (secp256k1_ecmult_gen_context *)auStack_3c0,
       (uVar12 + 0x1000003d0 & uVar15 & (ulong)a_00 & (ulong)ecmult_gen_ctx &
       (uVar21 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00110939;
  }
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11003e;
  secp256k1_fe_sqr((secp256k1_fe *)auStack_300,(secp256k1_fe *)psVar17);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11004c;
  secp256k1_fe_mul((secp256k1_fe *)auStack_300,(secp256k1_fe *)auStack_300,(secp256k1_fe *)psVar17);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110054;
  secp256k1_fe_verify((secp256k1_fe *)auStack_300);
  auStack_300._0_8_ = auStack_300._0_8_ + 2;
  auStack_300._40_4_ = auStack_300._40_4_ + 1;
  auStack_300._44_4_ = 0;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110077;
  secp256k1_fe_verify((secp256k1_fe *)auStack_300);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110085;
  secp256k1_fe_mul((secp256k1_fe *)psVar19,(secp256k1_fe *)auStack_3c0,(secp256k1_fe *)auStack_300);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11008d;
  iVar11 = secp256k1_fe_is_square_var((secp256k1_fe *)psVar19);
  if (iVar11 == 0) goto LAB_001105e1;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1108a5;
  secp256k1_fe_inv_var((secp256k1_fe *)auStack_3c0,(secp256k1_fe *)auStack_3c0);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1108b8;
  secp256k1_fe_mul((secp256k1_fe *)auStack_3c0,(secp256k1_fe *)auStack_3c0,
                   (secp256k1_fe *)auStack_300);
  sStack_260.ge_offset.x._40_8_ = auStack_360._48_8_;
  sStack_260.ge_offset.y.n[0] = uStack_328;
  sStack_260.ge_offset.y.n[1] = uStack_320;
  sStack_260.ge_offset.y.n[2] = uStack_318;
  sStack_260.ge_offset.y.n[3] = (uint64_t)puStack_310;
  sStack_260.ge_offset.y.n[4] = uStack_308;
  psVar25 = (secp256k1_fe *)auStack_300;
LAB_00110694:
  ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(auStack_3c0 + 0x30);
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1106a1;
  iVar11 = secp256k1_fe_sqrt((secp256k1_fe *)ecmult_gen_ctx,(secp256k1_fe *)auStack_3c0);
  psVar17 = a;
  a_00 = psVar18;
  psVar27 = psVar25;
  psVar32 = a_01;
  if (iVar11 == 0) {
LAB_00110916:
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11091b;
    secp256k1_ellswift_elligatorswift_var_cold_12();
LAB_0011091b:
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110920;
    secp256k1_ellswift_elligatorswift_var_cold_11();
  }
  else {
    if ((((uint)r_00 & 5) == 5) || (((ulong)r_00 & 5) == 0)) {
      psVar16 = (secp256k1_fe *)(auStack_3c0 + 0x30);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1106c5;
      secp256k1_fe_verify(psVar16);
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1106d2;
      secp256k1_fe_verify_magnitude(psVar16,1);
      auStack_3c0._48_8_ = 0x3ffffbfffff0bc - auStack_3c0._48_8_;
      uStack_388 = 0x3ffffffffffffc - uStack_388;
      puStack_380 = (undefined1 *)(0x3ffffffffffffc - (long)puStack_380);
      uStack_378 = 0x3ffffffffffffc - uStack_378;
      puStack_370 = (uchar *)(0x3fffffffffffc - (long)puStack_370);
      uStack_368 = 2;
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110716;
      secp256k1_fe_verify(psVar16);
    }
    psVar16 = &secp256k1_ellswift_c4;
    if (((ulong)r_00 & 1) == 0) {
      psVar16 = &secp256k1_ellswift_c3;
    }
    psVar17 = (secp256k1_ecmult_gen_context *)(auStack_300 + 0x30);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11073f;
    a_00 = psVar17;
    secp256k1_fe_mul((secp256k1_fe *)psVar17,(secp256k1_fe *)psVar17,psVar16);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110747;
    secp256k1_fe_verify((secp256k1_fe *)psVar17);
    psVar32 = (secp256k1_ecmult_gen_context *)&sStack_260.ge_offset.x.magnitude;
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110757;
    ecmult_gen_ctx = psVar32;
    secp256k1_fe_verify((secp256k1_fe *)psVar32);
    if (0x20 < (int)sStack_260.ge_offset.y.n[4] + (int)uStack_2a8) goto LAB_0011091b;
    psVar17 = (secp256k1_ecmult_gen_context *)(auStack_300 + 0x30);
    auStack_300._48_8_ = auStack_300._48_8_ + sStack_260.ge_offset.x._40_8_;
    uStack_2c8 = uStack_2c8 + sStack_260.ge_offset.y.n[0];
    psStack_2c0 = (secp256k1_ecmult_gen_context *)
                  ((long)(psStack_2c0->ge_offset).x.n + (sStack_260.ge_offset.y.n[1] - 8));
    uStack_2b8 = uStack_2b8 + sStack_260.ge_offset.y.n[2];
    puStack_2b0 = puStack_2b0 + sStack_260.ge_offset.y.n[3];
    uStack_2a8 = (uint64_t)(uint)((int)sStack_260.ge_offset.y.n[4] + (int)uStack_2a8);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1107b1;
    data = (uchar *)sStack_260.ge_offset.y.n[3];
    secp256k1_fe_verify((secp256k1_fe *)psVar17);
    r = psStack_278;
    a_00 = (secp256k1_ecmult_gen_context *)(auStack_3c0 + 0x30);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1107c9;
    secp256k1_fe_mul((secp256k1_fe *)psStack_278,(secp256k1_fe *)a_00,(secp256k1_fe *)psVar17);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1107d1;
    secp256k1_fe_normalize_var((secp256k1_fe *)r);
    psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1107d9;
    ecmult_gen_ctx = r;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psVar30 = psStack_288;
    if (*(int *)((long)(r->ge_offset).x.n + 0x24) != 0) {
      psVar32 = *(secp256k1_ecmult_gen_context **)r;
      psVar17 = (secp256k1_ecmult_gen_context *)&(psStack_288->ge_offset).x.magnitude;
      psStack_3c8 = (secp256k1_ecmult_gen_context *)0x1107fd;
      ecmult_gen_ctx = psVar17;
      secp256k1_fe_verify((secp256k1_fe *)psVar17);
      psVar28 = psVar25;
      if (*(int *)((long)(psVar30->ge_offset).y.n + 0x24) != 0) {
        iVar11 = extraout_EAX;
        if ((((uint)psVar32 ^ *(uint *)psVar17) & 1) != 0) {
          psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110819;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110826;
          secp256k1_fe_verify_magnitude((secp256k1_fe *)r,1);
          uVar4 = (r->ge_offset).x.n[0];
          uVar5 = (r->ge_offset).x.n[1];
          uVar6 = (r->ge_offset).x.n[2];
          *(long *)r = 0x3ffffbfffff0bc - *(long *)r;
          (r->ge_offset).x.n[0] = 0x3ffffffffffffc - uVar4;
          (r->ge_offset).x.n[1] = 0x3ffffffffffffc - uVar5;
          (r->ge_offset).x.n[2] = 0x3ffffffffffffc - uVar6;
          (r->ge_offset).x.n[3] = 0x3fffffffffffc - (r->ge_offset).x.n[3];
          (r->ge_offset).x.n[4] = 2;
          psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11087d;
          secp256k1_fe_verify((secp256k1_fe *)r);
          psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110885;
          secp256k1_fe_normalize_var((secp256k1_fe *)r);
          iVar11 = extraout_EAX_00;
        }
        return iVar11;
      }
      goto LAB_00110925;
    }
  }
  psVar30 = r_00;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110925;
  secp256k1_ellswift_elligatorswift_var_cold_10();
  psVar28 = psVar27;
LAB_00110925:
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11092a;
  secp256k1_ellswift_elligatorswift_var_cold_9();
LAB_0011092a:
  a_01 = psVar32;
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x11092f;
  secp256k1_ellswift_elligatorswift_var_cold_3();
  psVar29 = psVar28;
LAB_0011092f:
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110934;
  secp256k1_ellswift_elligatorswift_var_cold_2();
  psVar24 = psVar29;
  psVar32 = a_01;
LAB_00110934:
  psStack_3c8 = (secp256k1_ecmult_gen_context *)0x110939;
  secp256k1_ellswift_elligatorswift_var_cold_13();
LAB_00110939:
  psStack_3c8 = (secp256k1_ecmult_gen_context *)secp256k1_ellswift_create;
  secp256k1_ellswift_elligatorswift_var_cold_8();
  psStack_3f0 = psVar17;
  psStack_3e8 = r;
  psStack_3e0 = psVar24;
  psStack_3d8 = psVar30;
  psStack_3d0 = psVar32;
  psStack_3c8 = psVar19;
  if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
    secp256k1_ellswift_create_cold_6();
  }
  else if (a_00 != (secp256k1_ecmult_gen_context *)0x0) {
    *(undefined1 (*) [16])&(a_00->ge_offset).x.magnitude = (undefined1  [16])0x0;
    (a_00->ge_offset).x.n[3] = 0;
    (a_00->ge_offset).x.n[4] = 0;
    (a_00->ge_offset).x.n[1] = 0;
    (a_00->ge_offset).x.n[2] = 0;
    a_00->built = 0;
    a_00->scalar_offset = 0;
    (a_00->ge_offset).x.n[0] = 0;
    if (ecmult_gen_ctx->built == 0) {
      secp256k1_ellswift_create_cold_4();
      return 0;
    }
    if (seckey == (uchar *)0x0) {
      secp256k1_ellswift_create_cold_3();
      return 0;
    }
    iVar11 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,asStack_534,&sStack_4f0,seckey);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_1();
    }
    secp256k1_fe_normalize_var(&sStack_4f0.x);
    secp256k1_fe_normalize_var(&sStack_4f0.y);
    sStack_488.s[0] = 0xd29e1bf5;
    sStack_488.s[1] = 0xf7025f42;
    sStack_488.s[2] = 0x9b024773;
    sStack_488.s[3] = 0x94cb7d5;
    sStack_488.s[4] = 0xe59ed789;
    sStack_488.s[5] = 0x3bc9786;
    sStack_488.s[6] = 0x68335b35;
    sStack_488.s[7] = 0x4e363b53;
    sStack_488.bytes = 0x40;
    secp256k1_sha256_write(&sStack_488,seckey,0x20);
    secp256k1_sha256_write(&sStack_488,"",0x20);
    if ((int)ecmult_gen_ctx[1].ge_offset.x.n[3] != 0) {
      secp256k1_ellswift_create_cold_2();
    }
    if (data != (uchar *)0x0) {
      secp256k1_sha256_write(&sStack_488,data,0x20);
    }
    secp256k1_ellswift_elligatorswift_var((uchar *)a_00,&sStack_420,&sStack_4f0,&sStack_488);
    secp256k1_fe_get_b32((uchar *)((a_00->ge_offset).x.n + 3),&sStack_420);
    cVar10 = ((byte)iVar11 ^ 1) - 1;
    auVar33 = ZEXT216(CONCAT11(cVar10,cVar10));
    auVar33 = pshuflw(auVar33,auVar33,0);
    uVar23 = auVar33._0_4_;
    lVar13 = 0;
    do {
      puVar1 = (uint *)((long)(a_00->ge_offset).x.n + lVar13 + -8);
      uVar7 = puVar1[1];
      uVar8 = puVar1[2];
      uVar9 = puVar1[3];
      puVar2 = (uint *)((long)(a_00->ge_offset).x.n + lVar13 + -8);
      *puVar2 = *puVar1 & uVar23;
      puVar2[1] = uVar7 & uVar23;
      puVar2[2] = uVar8 & uVar23;
      puVar2[3] = uVar9 & uVar23;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x40);
    return iVar11;
  }
  secp256k1_ellswift_create_cold_5();
  return 0;
}

Assistant:

int secp256k1_ellswift_encode(const secp256k1_context *ctx, unsigned char *ell64, const secp256k1_pubkey *pubkey, const unsigned char *rnd32) {
    secp256k1_ge p;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(ell64 != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(rnd32 != NULL);

    if (secp256k1_pubkey_load(ctx, &p, pubkey)) {
        secp256k1_fe t;
        unsigned char p64[64] = {0};
        size_t ser_size;
        int ser_ret;
        secp256k1_sha256 hash;

        /* Set up hasher state; the used RNG is H(pubkey || "\x00"*31 || rnd32 || cnt++), using
         * BIP340 tagged hash with tag "secp256k1_ellswift_encode". */
        secp256k1_ellswift_sha256_init_encode(&hash);
        ser_ret = secp256k1_eckey_pubkey_serialize(&p, p64, &ser_size, 1);
#ifdef VERIFY
        VERIFY_CHECK(ser_ret && ser_size == 33);
#else
        (void)ser_ret;
#endif
        secp256k1_sha256_write(&hash, p64, sizeof(p64));
        secp256k1_sha256_write(&hash, rnd32, 32);

        /* Compute ElligatorSwift encoding and construct output. */
        secp256k1_ellswift_elligatorswift_var(ell64, &t, &p, &hash); /* puts u in ell64[0..32] */
        secp256k1_fe_get_b32(ell64 + 32, &t); /* puts t in ell64[32..64] */
        return 1;
    }
    /* Only reached in case the provided pubkey is invalid. */
    memset(ell64, 0, 64);
    return 0;
}